

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::cancel_non_critical(torrent *this)

{
  pointer ptVar1;
  pointer pppVar2;
  peer_connection *this_00;
  pointer ppVar3;
  vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_> *pvVar4;
  size_type sVar5;
  pointer pppVar6;
  pending_block *k;
  piece_block *ppVar7;
  time_critical_piece *p;
  pointer ptVar8;
  vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_> rq;
  vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_> dq;
  set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  time_critical;
  vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_> local_90;
  vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_> local_78;
  _Rb_tree<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::_Identity<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ptVar8 = (this->m_time_critical_pieces).
           super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (this->m_time_critical_pieces).
           super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ptVar8 != ptVar1) {
    do {
      ::std::
      _Rb_tree<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::_Identity<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>,std::less<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
      ::
      _M_insert_unique<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                ((_Rb_tree<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::_Identity<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>,std::less<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                  *)&local_60,&ptVar8->piece);
      ptVar8 = ptVar8 + 1;
    } while (ptVar8 != ptVar1);
  }
  pppVar6 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pppVar2 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pppVar6 != pppVar2) {
    do {
      this_00 = *pppVar6;
      pvVar4 = peer_connection::download_queue(this_00);
      ::std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
      ::vector(&local_78,pvVar4);
      ppVar3 = local_78.
               super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar7 = &(local_78.
                      super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                      ._M_impl.super__Vector_impl_data._M_start)->block; ppVar7 != &ppVar3->block;
          ppVar7 = (piece_block *)&ppVar7[1].block_index) {
        sVar5 = ::std::
                set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                ::count((set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                         *)&local_60,&ppVar7->piece_index);
        if ((sVar5 == 0) && ((ppVar7[1].piece_index.m_val & 0x60000000) == 0)) {
          peer_connection::cancel_request(this_00,ppVar7,true);
        }
      }
      pvVar4 = peer_connection::request_queue(this_00);
      ::std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
      ::vector(&local_90,pvVar4);
      ppVar3 = local_90.
               super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar7 = &(local_90.
                      super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                      ._M_impl.super__Vector_impl_data._M_start)->block; ppVar7 != &ppVar3->block;
          ppVar7 = (piece_block *)&ppVar7[1].block_index) {
        sVar5 = ::std::
                set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                ::count((set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                         *)&local_60,&ppVar7->piece_index);
        if (sVar5 == 0) {
          peer_connection::cancel_request(this_00,ppVar7,true);
        }
      }
      if (&(local_90.
            super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
            ._M_impl.super__Vector_impl_data._M_start)->block != (piece_block *)0x0) {
        operator_delete(local_90.
                        super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.
                              super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.
                              super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (&(local_78.
            super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
            ._M_impl.super__Vector_impl_data._M_start)->block != (piece_block *)0x0) {
        operator_delete(local_78.
                        super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pppVar6 = pppVar6 + 1;
    } while (pppVar6 != pppVar2);
  }
  ::std::
  _Rb_tree<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::_Identity<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void torrent::cancel_non_critical()
	{
		std::set<piece_index_t> time_critical;
		for (auto const& p : m_time_critical_pieces)
			time_critical.insert(p.piece);

		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			// for each peer, go through its download and request queue
			// and cancel everything, except pieces that are time critical

			// make a copy of the download queue since we may be cancelling entries
			// from it from within the loop
			std::vector<pending_block> dq = p->download_queue();
			for (auto const& k : dq)
			{
				if (time_critical.count(k.block.piece_index)) continue;
				if (k.not_wanted || k.timed_out) continue;
				p->cancel_request(k.block, true);
			}

			// make a copy of the download queue since we may be cancelling entries
			// from it from within the loop
			std::vector<pending_block> rq = p->request_queue();
			for (auto const& k : rq)
			{
				if (time_critical.count(k.block.piece_index)) continue;
				p->cancel_request(k.block, true);
			}
		}
	}